

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O3

void absl::lts_20240722::container_internal::
     raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
     ::resize_impl(CommonFields *common,ulong new_capacity)

{
  undefined8 *puVar1;
  long lVar2;
  ulong uVar3;
  ctrl_t *pcVar4;
  undefined1 auVar5 [16];
  undefined8 uVar6;
  bool bVar7;
  MixingHashState MVar8;
  ulong uVar9;
  undefined8 *puVar10;
  size_t sVar11;
  size_t sVar12;
  undefined8 *puVar13;
  ctrl_t cVar14;
  ulong uVar15;
  FindInfo FVar16;
  HashSetResizeHelper resize_helper;
  undefined1 local_5a;
  undefined1 local_59;
  HeapOrSoo local_58;
  size_t local_48;
  byte local_40;
  undefined2 local_3f;
  
  if ((new_capacity != 0) && ((new_capacity + 1 & new_capacity) == 0)) {
    local_48 = common->capacity_;
    local_40 = (byte)common->size_ & 1;
    local_3f = 0;
    local_58._0_4_ = *(undefined4 *)&common->heap_or_soo_;
    local_58._4_4_ = *(undefined4 *)((long)&common->heap_or_soo_ + 4);
    local_58._8_4_ = *(undefined4 *)((long)&common->heap_or_soo_ + 8);
    local_58._12_4_ = *(undefined4 *)((long)&common->heap_or_soo_ + 0xc);
    common->capacity_ = new_capacity;
    bVar7 = HashSetResizeHelper::InitializeSlots<std::allocator<char>,32ul,false,false,8ul>
                      ((HashSetResizeHelper *)&local_58,common,&local_59,0xffffff80,0x20,0x20);
    if (local_48 != 0) {
      if (bVar7) {
        HashSetResizeHelper::
        GrowSizeIntoSingleGroup<absl::lts_20240722::container_internal::hash_policy_traits<absl::lts_20240722::container_internal::FlatHashSetPolicy<std::__cxx11::string>,void>,std::allocator<std::__cxx11::string>>
                  ((HashSetResizeHelper *)&local_58.heap,common,
                   (allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)common);
      }
      else {
        if ((char)local_3f == '\x01') {
          __assert_fail("!was_soo_",
                        "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                        ,0x7c2,
                        "void *absl::container_internal::HashSetResizeHelper::old_slots() const");
        }
        lVar2 = *(long *)((long)&common->heap_or_soo_ + 8);
        puVar13 = (undefined8 *)(CONCAT44(local_58._12_4_,local_58._8_4_) + 0x10);
        sVar12 = 0;
        sVar11 = local_48;
        do {
          if ((char)local_3f == '\x01') {
            __assert_fail("!was_soo_",
                          "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                          ,0x7be,
                          "ctrl_t *absl::container_internal::HashSetResizeHelper::old_ctrl() const")
            ;
          }
          if (-1 < *(char *)(CONCAT44(local_58._4_4_,local_58._0_4_) + sVar12)) {
            sVar11 = puVar13[-1];
            MVar8 = hash_internal::MixingHashState::combine_contiguous
                              ((MixingHashState)&hash_internal::MixingHashState::kSeed,
                               (uchar *)puVar13[-2],sVar11);
            auVar5._8_8_ = 0;
            auVar5._0_8_ = MVar8.state_ + sVar11;
            uVar15 = SUB168(auVar5 * ZEXT816(0x9ddfea08eb382d69),8) ^
                     SUB168(auVar5 * ZEXT816(0x9ddfea08eb382d69),0);
            FVar16 = absl::lts_20240722::container_internal::find_first_non_full<void>
                               (common,uVar15);
            uVar9 = FVar16.offset;
            uVar3 = common->capacity_;
            if (uVar3 <= uVar9) {
              __assert_fail("i < c.capacity()",
                            "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                            ,0x70c,
                            "void absl::container_internal::DoSanitizeOnSetCtrl(const CommonFields &, size_t, ctrl_t, size_t)"
                           );
            }
            cVar14 = (ctrl_t)uVar15 & ~kEmpty;
            pcVar4 = (common->heap_or_soo_).heap.control;
            pcVar4[uVar9] = cVar14;
            pcVar4[(ulong)((uint)uVar3 & 0xf) + (uVar9 - 0xf & uVar3)] = cVar14;
            puVar1 = (undefined8 *)(lVar2 + uVar9 * 0x20);
            puVar10 = (undefined8 *)(uVar9 * 0x20 + lVar2);
            *puVar10 = puVar10 + 2;
            if (puVar13 == (undefined8 *)puVar13[-2]) {
              uVar6 = puVar13[1];
              puVar10[2] = *puVar13;
              puVar10[3] = uVar6;
            }
            else {
              *puVar1 = (undefined8 *)puVar13[-2];
              puVar1[2] = *puVar13;
            }
            puVar1[1] = puVar13[-1];
            puVar13[-2] = puVar13;
            puVar13[-1] = 0;
            *(undefined1 *)puVar13 = 0;
            sVar11 = local_48;
          }
          sVar12 = sVar12 + 1;
          puVar13 = puVar13 + 4;
        } while (sVar12 != sVar11);
        if ((common->size_ & 1) != 0) {
          CommonFields::backing_array_start(common);
        }
      }
      HashSetResizeHelper::DeallocateOld<8ul,std::allocator<char>>
                ((HashSetResizeHelper *)&local_58,&local_5a,0x20);
    }
    return;
  }
  __assert_fail("IsValidCapacity(new_capacity)",
                "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                ,0xe14,
                "static void absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<std::basic_string<char>>, absl::container_internal::StringHash, absl::container_internal::StringEq, std::allocator<std::basic_string<char>>>::resize_impl(CommonFields &, size_t, HashtablezInfoHandle) [Policy = absl::container_internal::FlatHashSetPolicy<std::basic_string<char>>, Hash = absl::container_internal::StringHash, Eq = absl::container_internal::StringEq, Alloc = std::allocator<std::basic_string<char>>]"
               );
}

Assistant:

inline bool IsValidCapacity(size_t n) { return ((n + 1) & n) == 0 && n > 0; }